

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

void do_mem_zpa(DisasContext_conflict1 *s,int zt,int pg,TCGv_i64 addr,int dtype,
               gen_helper_gvec_mem *fn)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_ptr a;
  uint32_t uVar1;
  TCGMemOpIdx TVar2;
  int iVar3;
  TCGv_i32 arg;
  TCGv_ptr r;
  int desc;
  TCGv_i32 t_desc;
  TCGv_ptr t_pg;
  uint vsz;
  TCGContext_conflict1 *tcg_ctx;
  gen_helper_gvec_mem *fn_local;
  int dtype_local;
  TCGv_i64 addr_local;
  int pg_local;
  int zt_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar1 = vec_full_reg_size(s);
  TVar2 = sve_memopidx(s,dtype);
  uVar1 = simd_desc_aarch64(uVar1,uVar1,zt << 8 | TVar2);
  arg = tcg_const_i32_aarch64(tcg_ctx_00,uVar1);
  r = tcg_temp_new_ptr(tcg_ctx_00);
  a = tcg_ctx_00->cpu_env;
  iVar3 = pred_full_reg_offset(s,pg);
  tcg_gen_addi_ptr(tcg_ctx_00,r,a,(long)iVar3);
  (*fn)(tcg_ctx_00,tcg_ctx_00->cpu_env,r,addr,arg);
  tcg_temp_free_ptr(tcg_ctx_00,r);
  tcg_temp_free_i32(tcg_ctx_00,arg);
  return;
}

Assistant:

static void do_mem_zpa(DisasContext *s, int zt, int pg, TCGv_i64 addr,
                       int dtype, gen_helper_gvec_mem *fn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    unsigned vsz = vec_full_reg_size(s);
    TCGv_ptr t_pg;
    TCGv_i32 t_desc;
    int desc;

    /* For e.g. LD4, there are not enough arguments to pass all 4
     * registers as pointers, so encode the regno into the data field.
     * For consistency, do this even for LD1.
     */
    desc = sve_memopidx(s, dtype);
    desc |= zt << MEMOPIDX_SHIFT;
    desc = simd_desc(vsz, vsz, desc);
    t_desc = tcg_const_i32(tcg_ctx, desc);
    t_pg = tcg_temp_new_ptr(tcg_ctx);

    tcg_gen_addi_ptr(tcg_ctx, t_pg, tcg_ctx->cpu_env, pred_full_reg_offset(s, pg));
    fn(tcg_ctx, tcg_ctx->cpu_env, t_pg, addr, t_desc);

    tcg_temp_free_ptr(tcg_ctx, t_pg);
    tcg_temp_free_i32(tcg_ctx, t_desc);
}